

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

time_t FILEFileTimeToUnixTime(FILETIME FileTime,long *nsec)

{
  long UnixTime;
  long *nsec_local;
  FILETIME FileTime_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (nsec != (long *)0x0) {
    *nsec = (((long)FileTime + -0x19db1ded53e8000) % 10000000) * 100;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return ((long)FileTime + -0x19db1ded53e8000) / 10000000;
  }
  abort();
}

Assistant:

time_t FILEFileTimeToUnixTime( FILETIME FileTime, long *nsec )
{
    __int64 UnixTime;

    /* get the full win32 value, in 100ns */
    UnixTime = ((__int64)FileTime.dwHighDateTime << 32) + 
        FileTime.dwLowDateTime;

    /* convert to the Unix epoch */
    UnixTime -= (SECS_BETWEEN_1601_AND_1970_EPOCHS * SECS_TO_100NS);

    TRACE("nsec=%p\n", nsec);

    if ( nsec )
    {
        /* get the number of 100ns, convert to ns */
        *nsec = (UnixTime % SECS_TO_100NS) * 100;
    }

    UnixTime /= SECS_TO_100NS; /* now convert to seconds */

    if ( (time_t)UnixTime != UnixTime )
    {
        WARN("Resulting value is too big for a time_t value\n");
    }

    TRACE("Win32 FILETIME = [%#x:%#x] converts to Unix time = [%ld.%09ld]\n", 
          FileTime.dwHighDateTime, FileTime.dwLowDateTime ,(long) UnixTime,
          nsec?*nsec:0L);

    return (time_t)UnixTime;
}